

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O1

int __thiscall
DirectionalScannerO1::nextOnLeft
          (DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pPVar4;
  bool bVar5;
  bool *pbVar6;
  bool *pbVar7;
  int iVar8;
  int y;
  Pt2i PStack_38;
  
  if (((this->super_DirectionalScanner).clearance == true) &&
     (pPVar4 = (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
     _M_finish != pPVar4)) {
    (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pPVar4;
  }
  if (this->lstop == true) {
    piVar1 = &(this->super_DirectionalScanner).lcy;
    *piVar1 = *piVar1 + -1;
    pbVar6 = (this->super_DirectionalScanner).lst2 + -1;
    (this->super_DirectionalScanner).lst2 = pbVar6;
    if (pbVar6 < (this->super_DirectionalScanner).steps) {
      (this->super_DirectionalScanner).lst2 = (this->super_DirectionalScanner).fs + -1;
    }
    bVar5 = false;
  }
  else {
    pbVar6 = (this->super_DirectionalScanner).steps;
    pbVar7 = this->lst1;
    this->lst1 = pbVar7 + -1;
    if (pbVar7 + -1 < pbVar6) {
      this->lst1 = (this->super_DirectionalScanner).fs + -1;
    }
    piVar1 = &(this->super_DirectionalScanner).lcx;
    *piVar1 = *piVar1 + -1;
    if (*this->lst1 != true) goto LAB_00138d69;
    iVar8 = (this->super_DirectionalScanner).lcy;
    (this->super_DirectionalScanner).lcy = iVar8 + -1;
    pbVar7 = (this->super_DirectionalScanner).lst2 + -1;
    (this->super_DirectionalScanner).lst2 = pbVar7;
    if (pbVar7 < pbVar6) {
      (this->super_DirectionalScanner).lst2 = (this->super_DirectionalScanner).fs + -1;
    }
    pbVar7 = (this->super_DirectionalScanner).lst2;
    if (*pbVar7 != true) goto LAB_00138d69;
    pbVar7 = pbVar7 + 1;
    if (pbVar7 < (this->super_DirectionalScanner).fs) {
      pbVar6 = pbVar7;
    }
    (this->super_DirectionalScanner).lst2 = pbVar6;
    (this->super_DirectionalScanner).lcy = iVar8;
    bVar5 = true;
  }
  this->lstop = bVar5;
LAB_00138d69:
  iVar8 = (this->super_DirectionalScanner).lcx;
  y = (this->super_DirectionalScanner).lcy;
  pbVar6 = (this->super_DirectionalScanner).lst2;
  iVar2 = (this->super_DirectionalScanner).ymin;
  iVar3 = (this->super_DirectionalScanner).xmax;
  if (y < iVar2 || iVar3 <= iVar8) {
    do {
      if ((this->super_DirectionalScanner).dlb * y + (this->super_DirectionalScanner).dla * iVar8 <
          (this->super_DirectionalScanner).dlc2) break;
      y = y + 1;
      iVar8 = iVar8 - (uint)*pbVar6;
      pbVar6 = pbVar6 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar6) {
        pbVar6 = (this->super_DirectionalScanner).steps;
      }
    } while (y < iVar2 || iVar3 <= iVar8);
  }
  if ((((this->super_DirectionalScanner).dlc2 <=
        (this->super_DirectionalScanner).dlb * y + (this->super_DirectionalScanner).dla * iVar8) &&
      ((this->super_DirectionalScanner).xmin <= iVar8)) &&
     (y < (this->super_DirectionalScanner).ymax)) {
    do {
      Pt2i::Pt2i(&PStack_38,iVar8,y);
      std::vector<Pt2i,_std::allocator<Pt2i>_>::emplace_back<Pt2i>(scan,&PStack_38);
      pbVar7 = pbVar6 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar7) {
        pbVar7 = (this->super_DirectionalScanner).steps;
      }
      iVar8 = iVar8 - (uint)*pbVar6;
      y = y + 1;
    } while ((((this->super_DirectionalScanner).dlc2 <=
               (this->super_DirectionalScanner).dlb * y +
               (this->super_DirectionalScanner).dla * iVar8) &&
             ((this->super_DirectionalScanner).xmin <= iVar8)) &&
            (pbVar6 = pbVar7, y < (this->super_DirectionalScanner).ymax));
  }
  return (int)((ulong)((long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int DirectionalScannerO1::nextOnLeft (std::vector<Pt2i> &scan)
{
  // Prepares the next scan
  if (clearance) scan.clear ();
  if (lstop)
  {
    lcy --;
    if (--lst2 < steps) lst2 = fs - 1;
    lstop = false;
  }
  else
  {
    if (--lst1 < steps) lst1 = fs - 1;
    lcx --;
    if (*lst1)
    {
      lcy --;
      if (--lst2 < steps) lst2 = fs - 1;
      if (*lst2)
      {
        if (++lst2 >= fs) lst2 = steps;
        lcy ++;
        lstop = true;
      }
    }
  }

  // Computes the next scan
  int x = lcx;
  int y = lcy;
  bool *nst = lst2;
  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}